

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall Stack<for_emplace>::Node::~Node(Node *this)

{
  Node *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->next;
  if (this_00 != (Node *)0x0) {
    ~Node(this_00);
    operator_delete(this_00,0x30);
    this->next = (Node *)0x0;
  }
  pcVar1 = (this->data).s._M_dataplus._M_p;
  paVar2 = &(this->data).s.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Node() {
			if (next != nullptr) {
				delete next;
				next = nullptr;
			}
		}